

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O2

void node::
     index_tree<node::TreeIndexJSON,label::JSONLabel,cost_model::UnitCostModelJSON<label::JSONLabel>>
               (TreeIndexJSON *ti,Node<label::JSONLabel> *n,LabelDictionary<label::JSONLabel> *ld,
               UnitCostModelJSON<label::JSONLabel> *cm)

{
  pointer piVar1;
  int iVar2;
  pointer piVar3;
  size_type __new_size;
  int ts;
  PostLToLCh *local_60;
  UnitCostModelJSON<label::JSONLabel> *local_58;
  LabelDictionary<label::JSONLabel> *local_50;
  int fid;
  int height;
  int subtree_max_depth;
  int start_postorder;
  int start_preorder;
  
  local_58 = cm;
  local_50 = ld;
  iVar2 = Node<label::JSONLabel>::get_tree_size(n);
  (ti->super_Constants).tree_size_ = iVar2;
  __new_size = (size_type)iVar2;
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PostLToSize).postl_to_size_,__new_size)
  ;
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToParent).postl_to_parent_,__new_size);
  piVar1 = (ti->super_PostLToParent).postl_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (piVar3 = (ti->super_PostLToParent).postl_to_parent_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    *piVar3 = -1;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&(ti->super_PostLToChildren).postl_to_children_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToLabelId).postl_to_label_id_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PostLToType).postl_to_type_,__new_size)
  ;
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToDepth).postl_to_depth_,__new_size);
  local_60 = &ti->super_PostLToLCh;
  std::vector<int,_std::allocator<int>_>::resize(&local_60->postl_to_lch_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToKRAncestor).postl_to_kr_ancestor_,__new_size);
  piVar3 = (ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)&ti->super_InvertedListLabelIdToPostL);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToFavChild).postl_to_fav_child_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToFavChild).postl_to_left_fav_child_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToHeight).postl_to_height_,__new_size);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&(ti->super_PostLToOrderedChildSize).postl_to_ordered_child_size_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToFavorableChildOrder).postl_to_favorder_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToLeftSibling).postl_to_left_sibling_,__new_size);
  start_preorder = 0;
  start_postorder = 0;
  subtree_max_depth = 0;
  height = 0;
  index_tree_recursion<node::TreeIndexJSON,label::JSONLabel,cost_model::UnitCostModelJSON<label::JSONLabel>>
            (ti,n,local_50,local_58,&start_preorder,&start_postorder,0,&subtree_max_depth,0,&height,
             -1,false);
  ts = iVar2 + -1;
  fid = 0;
  fav_child_processing_order<node::TreeIndexJSON>(ti,&ts,&fid);
  ts = start_postorder + -1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&(ti->super_ListKR).list_kr_,&ts);
  fill_kr_ancestors(&(ti->super_PostLToKRAncestor).postl_to_kr_ancestor_,&local_60->postl_to_lch_,
                    &(ti->super_ListKR).list_kr_);
  return;
}

Assistant:

void index_tree(TreeIndex& ti, const node::Node<Label>& n,
    label::LabelDictionary<Label>& ld, const CostModel& cm) {
  
  int tree_size = n.get_tree_size();
  ti.tree_size_ = tree_size;
  
  // Resize and clear the indexes.
  // TODO: Resizing is not enough for some vectors in case the same TreeIndex
  //       object is used for multiple trees. Old incorrect values may remain
  //       in the vectors.
  if constexpr (std::is_base_of<PostLToSize, TreeIndex>::value) {
    ti.postl_to_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToSize, TreeIndex>::value) {
    ti.prel_to_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToParent, TreeIndex>::value) {
    ti.postl_to_parent_.resize(tree_size);
    std::fill(ti.postl_to_parent_.begin(), ti.postl_to_parent_.end(), -1);
  }
  if constexpr (std::is_base_of<PreLToParent, TreeIndex>::value) {
    ti.prel_to_parent_.resize(tree_size);
    std::fill(ti.prel_to_parent_.begin(), ti.prel_to_parent_.end(), -1);
  }
  if constexpr (std::is_base_of<PostLToPreL, TreeIndex>::value) {
    ti.postl_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPostL, TreeIndex>::value) {
    ti.prel_to_postl_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPreR, TreeIndex>::value) {
    ti.prel_to_prer_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreRToPreL, TreeIndex>::value) {
    ti.prer_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPostR, TreeIndex>::value) {
    ti.prel_to_postr_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToPreL, TreeIndex>::value) {
    ti.postr_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToChildren, TreeIndex>::value) {
    ti.postl_to_children_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToChildren, TreeIndex>::value) {
    ti.prel_to_children_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToLabelId, TreeIndex>::value) {
    ti.prel_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLabelId, TreeIndex>::value) {
    ti.postl_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToType, TreeIndex>::value) {
    ti.postl_to_type_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToLabelId, TreeIndex>::value) {
    ti.postr_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLLD, TreeIndex>::value) {
    ti.postl_to_lld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToLLD, TreeIndex>::value) {
    ti.prel_to_lld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToRLD, TreeIndex>::value) {
    ti.prel_to_rld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToRLD, TreeIndex>::value) {
    ti.postr_to_rld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToDepth, TreeIndex>::value) {
    ti.postl_to_depth_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLCh, TreeIndex>::value) {
    ti.postl_to_lch_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToSubtreeMaxDepth, TreeIndex>::value) {
    ti.postl_to_subtree_max_depth_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToKRAncestor, TreeIndex>::value) {
    ti.postl_to_kr_ancestor_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreToLn, TreeIndex>::value) {
    ti.prel_to_ln_.resize(tree_size);
    ti.prer_to_ln_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToTypeLeft, TreeIndex>::value) {
    ti.prel_to_type_left_.resize(tree_size);
    std::fill(ti.prel_to_type_left_.begin(), ti.prel_to_type_left_.end(), false);
  }
  if constexpr (std::is_base_of<PreLToTypeRight, TreeIndex>::value) {
    ti.prel_to_type_right_.resize(tree_size);
    std::fill(ti.prel_to_type_right_.begin(), ti.prel_to_type_right_.end(), false);
  }
  if constexpr (std::is_base_of<PreLToSpfCost, TreeIndex>::value) {
    ti.prel_to_cost_all_.resize(tree_size);
    std::fill(ti.prel_to_cost_all_.begin(), ti.prel_to_cost_all_.end(), 0);
    ti.prel_to_cost_left_.resize(tree_size);
    std::fill(ti.prel_to_cost_left_.begin(), ti.prel_to_cost_left_.end(), 0);
    ti.prel_to_cost_right_.resize(tree_size);
    std::fill(ti.prel_to_cost_right_.begin(), ti.prel_to_cost_right_.end(), 0);
  }
  if constexpr (std::is_base_of<PreLToSubtreeCost, TreeIndex>::value) {
    ti.prel_to_subtree_del_cost_.resize(tree_size);
    std::fill(ti.prel_to_subtree_del_cost_.begin(), ti.prel_to_subtree_del_cost_.end(), 0.0);
    ti.prel_to_subtree_ins_cost_.resize(tree_size);
    std::fill(ti.prel_to_subtree_ins_cost_.begin(), ti.prel_to_subtree_ins_cost_.end(), 0.0);
  }
  if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
    ti.list_kr_.clear();
  }
  if constexpr (std::is_base_of<InvertedListDepthToPostL, TreeIndex>::value) {
    ti.inverted_list_depth_to_postl_.clear();
  }
  if constexpr (std::is_base_of<InvertedListLabelIdToPostL, TreeIndex>::value) {
    ti.inverted_list_label_id_to_postl_.clear();
  }
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_fav_child_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_left_fav_child_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
    ti.postl_to_height_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToOrderedChildSize, TreeIndex>::value) {
    ti.postl_to_ordered_child_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToFavorableChildOrder, TreeIndex>::value) {
    ti.postl_to_favorder_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLeftSibling, TreeIndex>::value) {
    ti.postl_to_left_sibling_.resize(tree_size);
  }

  // Orders start with '0'. Are modified by the recursive traversal.
  int start_preorder = 0;
  int start_postorder = 0;
  int start_depth = 0;
  int start_height = 0;

  // Maximum input tree depth - the first reference passed to recursion.
  int subtree_max_depth = 0;
  // Initial height.
  int height = 0;
  index_tree_recursion(ti, n, ld, cm, start_preorder, start_postorder,
      start_depth, subtree_max_depth, start_height, height, -1, false);
  
  if constexpr (std::is_base_of<PostLToFavorableChildOrder, TreeIndex>::value) {
    // Compute favorable child order.
    int ts = tree_size - 1;
    int fid = 0;
    fav_child_processing_order(ti, ts, fid);
  }

  if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
    // Add root to kr - not added in the recursion.
    ti.list_kr_.push_back(start_postorder-1);
  }

  if constexpr (std::is_base_of<PostLToKRAncestor, TreeIndex>::value) {
    fill_kr_ancestors(ti.postl_to_kr_ancestor_, ti.postl_to_lch_, ti.list_kr_);
  }

  if constexpr (std::is_base_of<PreToLn, TreeIndex>::value) {
    fill_ln(ti.prel_to_ln_, ti.prer_to_ln_, ti.prel_to_size_, ti.prer_to_prel_);
  }

  if constexpr (std::is_base_of<PostRToRLD, TreeIndex>::value) {
    fill_rld(ti.postr_to_rld_, ti.prel_to_size_, ti.postr_to_prel_,
        ti.prel_to_postr_, ti.prel_to_children_);
  }
}